

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

void crnlib::split_vectors<crnlib::vec<1u,float>>
               (vec<1U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<1U,_float> (*result) [2])

{
  uint uVar1;
  bool bVar2;
  vec<1U,_float> *pvVar3;
  row_vec *prVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  float local_584;
  float local_57c;
  float local_564;
  float local_544;
  float local_520;
  float local_504;
  float local_4ec;
  vec<1U,_float> *local_4d0;
  float total_variance;
  double right_dist2;
  double left_dist2;
  vec<1U,_float> *v_5;
  double dStack_4a0;
  uint i_6;
  double right_ttsum;
  double left_ttsum;
  vec<1U,_float> local_488;
  vec<1U,_float> new_right_child_1;
  vec<1U,_float> new_left_child_1;
  uint total_loops;
  uint cMaxLoops;
  float right_variance;
  float left_variance;
  float prev_total_variance;
  uint64 right_weight;
  uint64 left_weight;
  vec<1U,_float> local_458;
  vec<1U,_float> local_454;
  double local_450;
  double t;
  vec<1U,_float> *pvStack_440;
  float weight_1;
  vec<1U,_float> *v_4;
  double dStack_430;
  uint i_5;
  double right_weight_1;
  double left_weight_1;
  vec<1U,_float> local_418;
  vec<1U,_float> new_right_child;
  vec<1U,_float> new_left_child;
  uint j;
  double sum;
  double dStack_400;
  uint i_4;
  double max_sum;
  vec<1U,_float> x_2;
  uint iter;
  vec<1U,_float> axis;
  uint y_1;
  uint x_1;
  float divider;
  uint y;
  uint x;
  vec<1U,_float> w;
  vec<1U,_float> *v_3;
  matrix<1U,_1U,_float> local_3c0;
  uint i_3;
  matrix<1U,_1U,_float> covar;
  uint N;
  vec<1U,_float> local_3b0;
  vec<1U,_float> right_child;
  vec<1U,_float> left_child;
  double dist_1;
  vec<1U,_float> *v_2;
  uint i_2;
  double opposite_dist;
  double dStack_380;
  vec<1U,_float> opposite;
  double dist;
  vec<1U,_float> *v_1;
  double dStack_368;
  uint i_1;
  double furthest_dist;
  vec<1U,_float> furthest;
  float variance;
  uint weight;
  vec<1U,_float> *v;
  double dStack_340;
  uint i;
  double ttsum;
  uint64 total_weight;
  vec<1U,_float> centroid;
  double weightedDotProducts [64];
  vec<1U,_float> weightedVectors [64];
  vec<1U,_float> (*result_local) [2];
  uint size_local;
  uint (*weights_local) [64];
  vec<1U,_float> (*vectors_local) [64];
  
  local_4d0 = (vec<1U,_float> *)(weightedDotProducts + 0x3f);
  weightedVectors._248_8_ = result;
  do {
    vec<1U,_float>::vec(local_4d0);
    local_4d0 = local_4d0 + 1;
  } while (local_4d0 != weightedVectors + 0x3e);
  vec<1U,_float>::vec((vec<1U,_float> *)((long)&total_weight + 4),cClear);
  ttsum = 0.0;
  dStack_340 = 0.0;
  for (v._4_4_ = 0; v._4_4_ < size; v._4_4_ = v._4_4_ + 1) {
    pvVar3 = *vectors + v._4_4_;
    uVar1 = (*weights)[v._4_4_];
    operator*((crnlib *)&furthest,pvVar3,(float)uVar1);
    vec<1U,_float>::operator=(weightedVectors + ((ulong)v._4_4_ - 2),&furthest);
    vec<1U,_float>::operator+=
              ((vec<1U,_float> *)((long)&total_weight + 4),weightedVectors + ((ulong)v._4_4_ - 2));
    ttsum = (double)((long)ttsum + (ulong)uVar1);
    fVar6 = vec<1U,_float>::dot(pvVar3,pvVar3);
    *(double *)(&stack0xfffffffffffffcd8 + (ulong)v._4_4_ * 8) = (double)(fVar6 * (float)uVar1);
    dStack_340 = *(double *)(&stack0xfffffffffffffcd8 + (ulong)v._4_4_ * 8) + dStack_340;
  }
  fVar6 = vec<1U,_float>::dot((vec<1U,_float> *)((long)&total_weight + 4),
                              (vec<1U,_float> *)((long)&total_weight + 4));
  local_4ec = (float)(ulong)ttsum;
  furthest_dist._4_4_ = (float)(dStack_340 - (double)(fVar6 / local_4ec));
  local_504 = (float)(ulong)ttsum;
  vec<1U,_float>::operator*=((vec<1U,_float> *)((long)&total_weight + 4),1.0 / local_504);
  pvVar3 = vec<1U,_float>::operator=
                     ((vec<1U,_float> *)(weightedVectors._248_8_ + 4),
                      (vec<1U,_float> *)((long)&total_weight + 4));
  vec<1U,_float>::operator=((vec<1U,_float> *)weightedVectors._248_8_,pvVar3);
  if ((0.0 < furthest_dist._4_4_) && (size != 1)) {
    vec<1U,_float>::vec((vec<1U,_float> *)&furthest_dist);
    dStack_368 = -1.0;
    for (v_1._4_4_ = 0; v_1._4_4_ < size; v_1._4_4_ = v_1._4_4_ + 1) {
      fVar6 = vec<1U,_float>::squared_distance
                        (*vectors + v_1._4_4_,(vec<1U,_float> *)((long)&total_weight + 4));
      dVar9 = (double)fVar6;
      dStack_380 = dVar9;
      if (dStack_368 < dVar9) {
        vec<1U,_float>::operator=((vec<1U,_float> *)&furthest_dist,*vectors + v_1._4_4_);
        dStack_368 = dVar9;
      }
    }
    vec<1U,_float>::vec((vec<1U,_float> *)((long)&opposite_dist + 4));
    fVar6 = -1.0;
    for (v_2._4_4_ = 0; v_2._4_4_ < size; v_2._4_4_ = v_2._4_4_ + 1) {
      fVar7 = vec<1U,_float>::squared_distance
                        (*vectors + v_2._4_4_,(vec<1U,_float> *)&furthest_dist);
      if (fVar6 < fVar7) {
        vec<1U,_float>::operator=((vec<1U,_float> *)((long)&opposite_dist + 4),*vectors + v_2._4_4_)
        ;
        fVar6 = fVar7;
      }
    }
    operator+((crnlib *)&local_3b0,(vec<1U,_float> *)&furthest_dist,
              (vec<1U,_float> *)((long)&total_weight + 4));
    operator*((crnlib *)&right_child,&local_3b0,0.5);
    operator+((crnlib *)&covar,(vec<1U,_float> *)((long)&opposite_dist + 4),
              (vec<1U,_float> *)((long)&total_weight + 4));
    operator*((crnlib *)&N,covar.m_rows,0.5);
    if (2 < size) {
      i_3 = 1;
      matrix<1U,_1U,_float>::matrix(&local_3c0);
      matrix<1U,_1U,_float>::clear(&local_3c0);
      for (v_3._4_4_ = 0; v_3._4_4_ < size; v_3._4_4_ = v_3._4_4_ + 1) {
        operator-((crnlib *)&x,*vectors + v_3._4_4_,(vec<1U,_float> *)((long)&total_weight + 4));
        _w = (crnlib *)&x;
        operator*((crnlib *)&y,(vec<1U,_float> *)&x,(float)(*weights)[v_3._4_4_]);
        bVar2 = false;
        while (!bVar2) {
          while (!bVar2) {
            prVar4 = matrix<1U,_1U,_float>::operator[](&local_3c0,0);
            pfVar5 = vec<1U,_float>::operator[](prVar4,0);
            fVar6 = *pfVar5;
            fVar7 = vec<1U,_float>::operator[]((vec<1U,_float> *)_w,0);
            fVar8 = vec<1U,_float>::operator[]((vec<1U,_float> *)&y,0);
            prVar4 = matrix<1U,_1U,_float>::operator[](&local_3c0,0);
            pfVar5 = vec<1U,_float>::operator[](prVar4,0);
            *pfVar5 = fVar7 * fVar8 + fVar6;
            bVar2 = true;
          }
          bVar2 = true;
        }
      }
      local_520 = (float)(ulong)ttsum;
      bVar2 = false;
      while (!bVar2) {
        while (!bVar2) {
          prVar4 = matrix<1U,_1U,_float>::operator[](&local_3c0,0);
          pfVar5 = vec<1U,_float>::operator[](prVar4,0);
          *pfVar5 = *pfVar5 / local_520;
          prVar4 = matrix<1U,_1U,_float>::operator[](&local_3c0,0);
          pfVar5 = vec<1U,_float>::operator[](prVar4,0);
          fVar6 = *pfVar5;
          prVar4 = matrix<1U,_1U,_float>::operator[](&local_3c0,0);
          pfVar5 = vec<1U,_float>::operator[](prVar4,0);
          *pfVar5 = fVar6;
          bVar2 = true;
        }
        bVar2 = true;
      }
      vec<1U,_float>::vec(&x_2,1.0);
      for (max_sum._4_4_ = 0; max_sum._4_4_ < 10; max_sum._4_4_ = max_sum._4_4_ + 1) {
        vec<1U,_float>::vec((vec<1U,_float> *)&max_sum);
        dStack_400 = 0.0;
        bVar2 = false;
        while (!bVar2) {
          _new_left_child = 0.0;
          for (new_right_child.m_s[0] = (float  [1])0.0; new_right_child.m_s[0] == 0.0;
              new_right_child.m_s[0] = (float  [1])((int)new_right_child.m_s[0] + 1)) {
            pfVar5 = vec<1U,_float>::operator[](&x_2,0);
            fVar6 = *pfVar5;
            prVar4 = matrix<1U,_1U,_float>::operator[](&local_3c0,0);
            pfVar5 = vec<1U,_float>::operator[](prVar4,(uint)new_right_child.m_s[0]);
            _new_left_child = (double)(fVar6 * *pfVar5) + _new_left_child;
          }
          pfVar5 = vec<1U,_float>::operator[]((vec<1U,_float> *)&max_sum,0);
          *pfVar5 = (float)_new_left_child;
          dStack_400 = _new_left_child;
          bVar2 = true;
        }
        if ((dStack_400 != 0.0) || (NAN(dStack_400))) {
          vec<1U,_float>::operator*=((vec<1U,_float> *)&max_sum,(float)(1.0 / dStack_400));
        }
        vec<1U,_float>::operator=(&x_2,(vec<1U,_float> *)&max_sum);
      }
      vec<1U,_float>::normalize(&x_2,(vec<1U,_float> *)0x0);
      vec<1U,_float>::vec(&local_418,0.0);
      vec<1U,_float>::vec((vec<1U,_float> *)((long)&left_weight_1 + 4),0.0);
      right_weight_1 = 0.0;
      dStack_430 = 0.0;
      for (v_4._4_4_ = 0; v_4._4_4_ < size; v_4._4_4_ = v_4._4_4_ + 1) {
        pvStack_440 = *vectors + v_4._4_4_;
        t._4_4_ = (float)(*weights)[v_4._4_4_];
        operator-((crnlib *)&local_454,pvStack_440,(vec<1U,_float> *)((long)&total_weight + 4));
        fVar6 = operator*(&local_454,&x_2);
        local_450 = (double)fVar6;
        if (0.0 <= local_450) {
          vec<1U,_float>::operator+=
                    ((vec<1U,_float> *)((long)&left_weight_1 + 4),
                     weightedVectors + ((ulong)v_4._4_4_ - 2));
          dStack_430 = (double)t._4_4_ + dStack_430;
        }
        else {
          vec<1U,_float>::operator+=(&local_418,weightedVectors + ((ulong)v_4._4_4_ - 2));
          right_weight_1 = (double)t._4_4_ + right_weight_1;
        }
      }
      if ((0.0 < right_weight_1) && (0.0 < dStack_430)) {
        operator*((crnlib *)&local_458,&local_418,(float)(1.0 / right_weight_1));
        vec<1U,_float>::operator=(&right_child,&local_458);
        operator*((crnlib *)((long)&left_weight + 4),(vec<1U,_float> *)((long)&left_weight_1 + 4),
                  (float)(1.0 / dStack_430));
        vec<1U,_float>::operator=((vec<1U,_float> *)&N,(vec<1U,_float> *)((long)&left_weight + 4));
      }
    }
    right_variance = 1e+10;
    for (new_right_child_1.m_s[0] = (float  [1])0.0; (uint)new_right_child_1.m_s[0] < 0x400;
        new_right_child_1.m_s[0] = (float  [1])((int)new_right_child_1.m_s[0] + 1)) {
      vec<1U,_float>::vec(&local_488,cClear);
      vec<1U,_float>::vec((vec<1U,_float> *)((long)&left_ttsum + 4),cClear);
      right_ttsum = 0.0;
      dStack_4a0 = 0.0;
      right_weight = 0;
      _left_variance = 0;
      for (v_5._4_4_ = 0; v_5._4_4_ < size; v_5._4_4_ = v_5._4_4_ + 1) {
        fVar6 = vec<1U,_float>::squared_distance(&right_child,*vectors + v_5._4_4_);
        fVar7 = vec<1U,_float>::squared_distance((vec<1U,_float> *)&N,*vectors + v_5._4_4_);
        if (fVar7 <= fVar6) {
          vec<1U,_float>::operator+=
                    ((vec<1U,_float> *)((long)&left_ttsum + 4),
                     weightedVectors + ((ulong)v_5._4_4_ - 2));
          dStack_4a0 = *(double *)(&stack0xfffffffffffffcd8 + (ulong)v_5._4_4_ * 8) + dStack_4a0;
          _left_variance = (*weights)[v_5._4_4_] + _left_variance;
        }
        else {
          vec<1U,_float>::operator+=(&local_488,weightedVectors + ((ulong)v_5._4_4_ - 2));
          right_ttsum = *(double *)(&stack0xfffffffffffffcd8 + (ulong)v_5._4_4_ * 8) + right_ttsum;
          right_weight = (*weights)[v_5._4_4_] + right_weight;
        }
      }
      if (right_weight == 0) {
        return;
      }
      if (_left_variance == 0) {
        return;
      }
      fVar6 = vec<1U,_float>::dot(&local_488,&local_488);
      local_544 = (float)right_weight;
      fVar7 = vec<1U,_float>::dot((vec<1U,_float> *)((long)&left_ttsum + 4),
                                  (vec<1U,_float> *)((long)&left_ttsum + 4));
      local_564 = (float)_left_variance;
      local_57c = (float)right_weight;
      vec<1U,_float>::operator*=(&local_488,1.0 / local_57c);
      local_584 = (float)_left_variance;
      vec<1U,_float>::operator*=((vec<1U,_float> *)((long)&left_ttsum + 4),1.0 / local_584);
      vec<1U,_float>::operator=(&right_child,&local_488);
      vec<1U,_float>::operator=((vec<1U,_float> *)&N,(vec<1U,_float> *)((long)&left_ttsum + 4));
      fVar6 = (float)(right_ttsum - (double)(fVar6 / local_544)) +
              (float)(dStack_4a0 - (double)(fVar7 / local_564));
      if ((fVar6 < 1e-05) || ((right_variance - fVar6) / fVar6 < 1e-05)) break;
      right_variance = fVar6;
    }
    vec<1U,_float>::operator=((vec<1U,_float> *)weightedVectors._248_8_,&right_child);
    vec<1U,_float>::operator=((vec<1U,_float> *)(weightedVectors._248_8_ + 4),(vec<1U,_float> *)&N);
  }
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2])
    {
        VectorType weightedVectors[64];
        double weightedDotProducts[64];
        VectorType centroid(cClear);
        uint64 total_weight = 0;
        double ttsum = 0.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            const uint weight = weights[i];
            weightedVectors[i] = v * (float)weight;
            centroid += weightedVectors[i];
            total_weight += weight;
            weightedDotProducts[i] = v.dot(v) * weight;
            ttsum += weightedDotProducts[i];
        }
        float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
        centroid *= (1.0f / total_weight);
        result[0] = result[1] = centroid;
        if (variance <= 0.0f || size == 1)
        {
            return;
        }
        VectorType furthest;
        double furthest_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(centroid);
            if (dist > furthest_dist)
            {
                furthest_dist = dist;
                furthest = v;
            }
        }
        VectorType opposite;
        double opposite_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(furthest);
            if (dist > opposite_dist)
            {
                opposite_dist = dist;
                opposite = v;
            }
        }
        VectorType left_child((furthest + centroid) * .5f);
        VectorType right_child((opposite + centroid) * .5f);
        if (size > 2)
        {
            const uint N = VectorType::num_elements;
            matrix<N, N, float> covar;
            covar.clear();
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i] - centroid;
                const VectorType w = v * (float)weights[i];
                for (uint x = 0; x < N; x++)
                {
                    for (uint y = x; y < N; y++)
                    {
                        covar[x][y] = covar[x][y] + v[x] * w[y];
                    }
                }
            }
            float divider = (float)total_weight;
            for (uint x = 0; x < N; x++)
            {
                for (uint y = x; y < N; y++)
                {
                    covar[x][y] /= divider;
                    covar[y][x] = covar[x][y];
                }
            }
            VectorType axis(1.0f);
            for (uint iter = 0; iter < 10; iter++)
            {
                VectorType x;
                double max_sum = 0;
                for (uint i = 0; i < N; i++)
                {
                    double sum = 0;
                    for (uint j = 0; j < N; j++)
                    {
                        sum += axis[j] * covar[i][j];
                    }
                    x[i] = (float)sum;
                    max_sum = i ? math::maximum(max_sum, sum) : sum;
                }
                if (max_sum != 0.0f)
                {
                    x *= (float)(1.0f / max_sum);
                }
                axis = x;
            }
            axis.normalize();
            VectorType new_left_child(0.0f);
            VectorType new_right_child(0.0f);
            double left_weight = 0.0f;
            double right_weight = 0.0f;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                const float weight = (float)weights[i];
                double t = (v - centroid) * axis;
                if (t < 0.0f)
                {
                    new_left_child += weightedVectors[i];
                    left_weight += weight;
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_weight += weight;
                }
            }
            if ((left_weight > 0.0f) && (right_weight > 0.0f))
            {
                left_child = new_left_child * (float)(1.0f / left_weight);
                right_child = new_right_child * (float)(1.0f / right_weight);
            }
        }
        uint64 left_weight = 0;
        uint64 right_weight = 0;
        float prev_total_variance = 1e+10f;
        float left_variance = 0.0f;
        float right_variance = 0.0f;
        const uint cMaxLoops = 1024;
        for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++)
        {
            VectorType new_left_child(cClear);
            VectorType new_right_child(cClear);
            double left_ttsum = 0.0f;
            double right_ttsum = 0.0f;
            left_weight = 0;
            right_weight = 0;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                double left_dist2 = left_child.squared_distance(v);
                double right_dist2 = right_child.squared_distance(v);
                if (left_dist2 < right_dist2)
                {
                    new_left_child += weightedVectors[i];
                    left_ttsum += weightedDotProducts[i];
                    left_weight += weights[i];
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_ttsum += weightedDotProducts[i];
                    right_weight += weights[i];
                }
            }
            if ((!left_weight) || (!right_weight))
            {
                return;
            }
            left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
            right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
            new_left_child *= (1.0f / left_weight);
            new_right_child *= (1.0f / right_weight);
            left_child = new_left_child;
            right_child = new_right_child;
            float total_variance = left_variance + right_variance;
            if (total_variance < .00001f)
            {
                break;
            }
            if (((prev_total_variance - total_variance) / total_variance) < .00001f)
            {
                break;
            }
            prev_total_variance = total_variance;
        }
        result[0] = left_child;
        result[1] = right_child;
    }